

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O3

void pdf_dict_del(hd_context *ctx,pdf_obj *obj,pdf_obj *key)

{
  char *pcVar1;
  pdf_obj *key_00;
  
  if (key < (pdf_obj *)0x189) {
    if ((key == (pdf_obj *)0x0) || ((pdf_obj *)0x185 < key)) {
LAB_0010e093:
      pcVar1 = pdf_objkindstr(key);
      hd_throw(ctx,2,"key is not a name (%s)",pcVar1);
    }
  }
  else if (key->kind != 'n') goto LAB_0010e093;
  if (key < (pdf_obj *)0x186) {
    key_00 = (pdf_obj *)PDF_NAMES[(long)key];
  }
  else {
    key_00 = key + 1;
  }
  pdf_dict_dels(ctx,obj,(char *)key_00);
  return;
}

Assistant:

void
pdf_dict_del(hd_context *ctx, pdf_obj *obj, pdf_obj *key)
{
    if (!OBJ_IS_NAME(key))
        hd_throw(ctx, HD_ERROR_GENERIC, "key is not a name (%s)", pdf_objkindstr(key));

    if (key < PDF_OBJ_NAME__LIMIT)
        pdf_dict_dels(ctx, obj, PDF_NAMES[(intptr_t)key]);
    else
        pdf_dict_dels(ctx, obj, NAME(key)->n);
}